

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

uint32 get32(stbi *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = get8(s);
  iVar2 = get8(s);
  iVar3 = get8(s);
  iVar4 = get8(s);
  return iVar4 + iVar3 * 0x100 + iVar2 * 0x10000 + iVar1 * 0x1000000;
}

Assistant:

static uint32 get32(stbi *s)
{
   uint32 z = get16(s);
   return (z << 16) + get16(s);
}